

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O0

void __thiscall Kernel::Term::Term(Term *this,Term *t)

{
  TermList *pTVar1;
  long in_RSI;
  undefined8 *in_RDI;
  uint32_t in_stack_ffffffffffffffcc;
  TermList *local_18;
  
  *in_RDI = &PTR_computable_013201f8;
  *(undefined4 *)(in_RDI + 1) = *(undefined4 *)(in_RSI + 8);
  *(uint *)((long)in_RDI + 0xc) =
       *(uint *)((long)in_RDI + 0xc) & 0xf0000000 | *(uint *)(in_RSI + 0xc) & 0xfffffff;
  *(uint *)((long)in_RDI + 0xc) = *(uint *)((long)in_RDI + 0xc) & 0xcfffffff;
  *(uint *)((long)in_RDI + 0xc) = *(uint *)((long)in_RDI + 0xc) & 0xbfffffff;
  *(uint *)((long)in_RDI + 0xc) = *(uint *)((long)in_RDI + 0xc) & 0x7fffffff;
  *(undefined4 *)(in_RDI + 2) = 0;
  *(undefined4 *)((long)in_RDI + 0x14) = 0xffffffff;
  *(undefined4 *)(in_RDI + 4) = 0;
  pTVar1 = (TermList *)(in_RDI + 5);
  do {
    local_18 = pTVar1;
    TermList::TermList(local_18);
    pTVar1 = local_18 + 1;
  } while (local_18 + 1 != (TermList *)(in_RDI + 6));
  in_RDI[5] = *(undefined8 *)(in_RSI + 0x28);
  TermList::_setShared(local_18,SUB41(in_stack_ffffffffffffffcc >> 0x18,0));
  TermList::_setOrder(local_18,in_stack_ffffffffffffffcc);
  TermList::_setDistinctVars(local_18,in_stack_ffffffffffffffcc);
  return;
}

Assistant:

Term::Term(const Term& t) throw()
  : _functor(t._functor),
    _arity(t._arity),
    _color(COLOR_TRANSPARENT),
    _hasInterpretedConstants(0),
    _isTwoVarEquality(0),
    _weight(0),
    _kboWeight(-1),
#if VDEBUG
    _kboInstance(nullptr),
#endif
    _vars(0)
{
  ASS(!isSpecial()); //we do not copy special terms

  _args[0] = t._args[0];
  _args[0]._setShared(false);
  _args[0]._setOrder(AO_UNKNOWN);
  _args[0]._setDistinctVars(TERM_DIST_VAR_UNKNOWN);
}